

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

Index __thiscall
MADPComponentFactoredStates::FactorValueIndicesToStateIndex
          (MADPComponentFactoredStates *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *s_e_vec,Scope *sfSC)

{
  pointer puVar1;
  pointer puVar2;
  Index IVar3;
  long lVar4;
  ulong uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_sf_e;
  allocator_type local_31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_30,
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_31);
  puVar1 = (sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar4 = (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar4 != 0) {
    puVar2 = (this->_m_sfacDomainSizes).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (ulong)(uint)puVar2[puVar1[uVar5]];
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)(lVar4 >> 2));
  }
  IVar3 = IndexTools::IndividualToJointIndices(s_e_vec,&local_30);
  if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return IVar3;
}

Assistant:

Index MADPComponentFactoredStates::
FactorValueIndicesToStateIndex(const vector<Index>& s_e_vec, 
        const Scope& sfSC) const
{
    vector<size_t> nr_sf_e(sfSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        _m_sfacDomainSizes, sfSC, nr_sf_e);
    Index sI_e = IndexTools::IndividualToJointIndices( s_e_vec, nr_sf_e);
    return(sI_e);
}